

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O0

qsizetype __thiscall
QByteArrayMatcher::indexIn(QByteArrayMatcher *this,QByteArrayView data,qsizetype from)

{
  uchar *cc;
  qsizetype qVar1;
  long in_RCX;
  long in_RDI;
  long in_FS_OFFSET;
  qsizetype local_28;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = in_RCX;
  if (in_RCX < 0) {
    local_28 = 0;
  }
  cc = (uchar *)QByteArrayView::data(&local_18);
  qVar1 = QByteArrayView::size(&local_18);
  qVar1 = bm_find(cc,qVar1,local_28,*(uchar **)(in_RDI + 0x120),*(qsizetype *)(in_RDI + 0x128),
                  (uchar *)(in_RDI + 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QByteArrayMatcher::indexIn(QByteArrayView data, qsizetype from) const
{
    if (from < 0)
        from = 0;
    return bm_find(reinterpret_cast<const uchar *>(data.data()), data.size(), from,
                   p.p, p.l, p.q_skiptable);
}